

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkaccessfilebackend_p.cpp
# Opt level: O2

int __thiscall
QNetworkAccessFileBackend::qt_metacall(QNetworkAccessFileBackend *this,Call _c,int _id,void **_a)

{
  int iVar1;
  QNetworkAccessFileBackend *_t;
  
  iVar1 = QNetworkAccessBackend::qt_metacall((QNetworkAccessBackend *)this,_c,_id,_a);
  if (-1 < iVar1) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (iVar1 == 0) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return iVar1;
      }
      if (iVar1 == 0) {
        uploadReadyReadSlot(this);
      }
    }
    iVar1 = iVar1 + -1;
  }
  return iVar1;
}

Assistant:

int QNetworkAccessFileBackend::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QNetworkAccessBackend::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}